

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O0

void aalcalcmeanonly::LoadOccurrence(void)

{
  FILE *__stream;
  undefined1 local_34 [8];
  occurrence occ_1;
  occurrence_granular occ;
  FILE *fin;
  int granularDate;
  int dateOpts;
  
  fin._0_4_ = 0;
  __stream = fopen("input/occurrence.bin","rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"FATAL: %s: cannot open %s\n","LoadOccurrence","input/occurrence.bin");
    exit(1);
  }
  fread((void *)((long)&fin + 4),4,1,__stream);
  fin._0_4_ = fin._4_4_ >> 1;
  if ((int)fin == 0) {
    LoadOccurrence<occurrence>((occurrence *)local_34,(FILE *)__stream);
  }
  else {
    LoadOccurrence<occurrence_granular>((occurrence_granular *)&occ_1.period_no,(FILE *)__stream);
  }
  return;
}

Assistant:

void LoadOccurrence() {

    int dateOpts;
    int granularDate = 0;
    FILE *fin = fopen(OCCURRENCE_FILE, "rb");
    if (fin == nullptr) {
      fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fread(&dateOpts, sizeof(dateOpts), 1, fin);
    granularDate = dateOpts >> 1;
    if (granularDate) {
      occurrence_granular occ;
      LoadOccurrence(occ, fin);
    } else {
      occurrence occ;
      LoadOccurrence(occ, fin);
    }

  }